

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.h
# Opt level: O1

void block_write_file<unsigned_char,r_file>(uchar *p,size_t size,r_file *f,size_t blockSize)

{
  size_t sVar1;
  runtime_error *this;
  size_t sVar2;
  
  if (size < blockSize) {
    sVar2 = 0;
  }
  else {
    sVar2 = size / blockSize;
    size = size % blockSize;
  }
  do {
    if (sVar2 == 0) {
      while( true ) {
        if (size == 0) {
          return;
        }
        sVar2 = fwrite(p,1,size,(FILE *)f->_f);
        if (sVar2 == 0) break;
        p = p + sVar2;
        size = size - sVar2;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Could not write to file.");
LAB_00109a2f:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar1 = fwrite(p,blockSize,sVar2,(FILE *)f->_f);
    if (sVar1 == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unable to write to file.");
      goto LAB_00109a2f;
    }
    p = p + sVar1 * blockSize;
    sVar2 = sVar2 - sVar1;
  } while( true );
}

Assistant:

void block_write_file(const T* p, size_t size, const F& f, size_t blockSize = 4096)
{
    size_t blocks = (size >= blockSize)?size / blockSize:0;
    size_t remainder = (size >= blockSize)?size % blockSize:size;
    const uint8_t* writeHead = (const uint8_t*)p;

    while(blocks > 0)
    {
        auto blocksWritten = fwrite((void*)writeHead, blockSize, blocks, f);
        if(blocksWritten == 0)
            throw std::runtime_error("Unable to write to file.");
        blocks -= blocksWritten;
        writeHead += (blocksWritten * blockSize);
    }

    while(remainder > 0)
    {
        auto bytesWritten = fwrite((void*)writeHead, 1, remainder, f);
        if(bytesWritten == 0)
            throw std::runtime_error("Could not write to file.");
        remainder -= bytesWritten;
        writeHead += bytesWritten;
    }
}